

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_TraceBleed(int damage,AActor *target)

{
  int iVar1;
  TAngle<double> local_50;
  TAngle<double> local_48;
  DVector3 local_40;
  TAngle<double> local_28;
  DAngle pitch;
  DAngle angle;
  AActor *target_local;
  int damage_local;
  
  if (target != (AActor *)0x0) {
    iVar1 = FRandom::operator()(&pr_tracebleed);
    TAngle<double>::TAngle(&pitch,(double)iVar1 * 1.40625);
    iVar1 = FRandom::operator()(&pr_tracebleed);
    TAngle<double>::TAngle(&local_28,(double)(iVar1 + -0x80) * 0.0054931640625);
    AActor::PosPlusZ(&local_40,target,target->Height / 2.0);
    TAngle<double>::TAngle(&local_48,&pitch);
    TAngle<double>::TAngle(&local_50,&local_28);
    P_TraceBleed(damage,&local_40,target,&local_48,&local_50);
  }
  return;
}

Assistant:

void P_TraceBleed(int damage, AActor *target)
{
	if (target != NULL)
	{
		DAngle angle = pr_tracebleed() * (360 / 256.);
		DAngle pitch = (pr_tracebleed() - 128) * (360 / 65536.);
		P_TraceBleed(damage, target->PosPlusZ(target->Height / 2), target, angle, pitch);
	}
}